

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int StringReplace(SyBlob *pWorker,sxu32 nOfft,int nLen,char *zReplace,int nReplen)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  sxu32 sVar6;
  
  uVar1 = pWorker->nByte;
  if (nOfft + nLen < uVar1) {
    pvVar2 = pWorker->pBlob;
    uVar5 = (ulong)(nOfft + nLen);
    sVar6 = nOfft;
    do {
      *(undefined1 *)((long)pvVar2 + (ulong)sVar6) = *(undefined1 *)((long)pvVar2 + uVar5);
      sVar6 = sVar6 + 1;
      uVar5 = uVar5 + 1;
    } while ((uint)uVar5 < uVar1);
    uVar1 = pWorker->nByte;
  }
  pvVar2 = (void *)(ulong)(uVar1 - nLen);
  pWorker->nByte = uVar1 - nLen;
  if (0 < nReplen) {
    uVar1 = SyBlobAppend(pWorker,(void *)0x0,nReplen);
    pvVar2 = (void *)(ulong)uVar1;
    if (uVar1 == 0) {
      pvVar2 = pWorker->pBlob;
      uVar1 = pWorker->nByte;
      uVar5 = (ulong)uVar1;
      if (uVar1 != nOfft) {
        iVar4 = nOfft - uVar1;
        do {
          iVar3 = (int)uVar5;
          uVar5 = (ulong)(iVar3 - 1);
          if (iVar3 == 0) {
            uVar5 = 0;
          }
          *(undefined1 *)((long)pvVar2 + (ulong)(uint)((int)uVar5 + nReplen)) =
               *(undefined1 *)((long)pvVar2 + uVar5);
          iVar4 = iVar4 + 1;
        } while (iVar4 != 0);
      }
      iVar4 = nReplen + 1;
      do {
        *(char *)((long)pvVar2 + (ulong)nOfft) = *zReplace;
        nOfft = nOfft + 1;
        zReplace = zReplace + 1;
        iVar4 = iVar4 + -1;
      } while (1 < iVar4);
      pWorker->nByte = pWorker->nByte + nReplen;
    }
  }
  return (int)pvVar2;
}

Assistant:

static int StringReplace(SyBlob *pWorker, sxu32 nOfft, int nLen, const char *zReplace, int nReplen)
{
	char *zInput = (char *)SyBlobData(pWorker);
	sxu32 n, m;
	n = SyBlobLength(pWorker);
	m = nOfft;
	/* Delete the old entry */
	STRDEL(zInput, n, m, nLen);
	SyBlobLength(pWorker) -= nLen;
	if( nReplen > 0 ){
		sxi32 iRep = nReplen;
		sxi32 rc;
		/*
		 * Make sure the working buffer is big enough to hold the replacement
		 * string.
		 */
		rc = SyBlobAppend(pWorker, 0/* Grow without an append operation*/, (sxu32)nReplen);
		if( rc != SXRET_OK ){
			/* Simply ignore any memory failure problem */
			return SXRET_OK;
		}
		/* Perform the insertion now */
		zInput = (char *)SyBlobData(pWorker);
		n = SyBlobLength(pWorker);
		SHIFTRANDINSERT(zInput, n, nOfft, zReplace, iRep);
		SyBlobLength(pWorker) += nReplen;
	}	
	return SXRET_OK;
}